

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RCX;
  
  uVar2 = 0xfffffffffffffffe;
  do {
    pcVar3 = (char *)(*(long *)beginPos + 2 + uVar2);
    uVar2 = uVar2 + 1;
  } while (*pcVar3 != '\0');
  if (uVar2 < amount) {
    pcVar3 = copyToNewBuffer("",0);
    this->buffer_ = pcVar3;
  }
  else {
    SimpleString(this,(char *)(*(long *)beginPos + amount));
    uVar2 = 0xffffffffffffffff;
    do {
      lVar1 = uVar2 + 1;
      uVar2 = uVar2 + 1;
    } while (this->buffer_[lVar1] != '\0');
    if (in_RCX < uVar2) {
      this->buffer_[in_RCX] = '\0';
    }
  }
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = buffer_ + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}